

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> __thiscall
jbcoin::Logs::makeSink(Logs *this,string *name,Severity threshold)

{
  long lVar1;
  _func_int **pp_Var2;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  
  pp_Var2 = (_func_int **)operator_new(0x38);
  *(undefined4 *)(pp_Var2 + 1) = in_ECX;
  *(undefined1 *)((long)pp_Var2 + 0xc) = 0;
  *pp_Var2 = (_func_int *)&PTR__Sink_002d33d8;
  pp_Var2[2] = (_func_int *)name;
  pp_Var2[3] = (_func_int *)(pp_Var2 + 5);
  lVar1 = *(long *)CONCAT44(in_register_00000014,threshold);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pp_Var2 + 3),lVar1,
             ((long *)CONCAT44(in_register_00000014,threshold))[1] + lVar1);
  this->_vptr_Logs = pp_Var2;
  return (__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
          )(__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<beast::Journal::Sink>
Logs::makeSink(std::string const& name,
    beast::severities::Severity threshold)
{
    return std::make_unique<Sink>(
        name, threshold, *this);
}